

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

int AF_A_ClearOverlays(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  long lVar5;
  PClass *pPVar6;
  int iVar7;
  undefined8 uVar8;
  PClass *pPVar9;
  DPSprite *pDVar10;
  char *__assertion;
  int u;
  int iVar11;
  int iVar12;
  int iVar13;
  DPSprite *this;
  bool bVar14;
  
  pPVar6 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0052f68e;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    puVar3 = (undefined8 *)(param->field_0).field_1.a;
    if (puVar3 != (undefined8 *)0x0) {
      if (puVar3[1] == 0) {
        uVar8 = (**(code **)*puVar3)(puVar3);
        puVar3[1] = uVar8;
      }
      pPVar9 = (PClass *)puVar3[1];
      bVar14 = pPVar9 != (PClass *)0x0;
      if (pPVar9 != pPVar6 && bVar14) {
        do {
          pPVar9 = pPVar9->ParentClass;
          bVar14 = pPVar9 != (PClass *)0x0;
          if (pPVar9 == pPVar6) break;
        } while (pPVar9 != (PClass *)0x0);
      }
      if (!bVar14) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0052f68e;
      }
    }
    pPVar6 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_0052f625;
      puVar4 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar4 != (undefined8 *)0x0) {
        if (puVar4[1] == 0) {
          uVar8 = (**(code **)*puVar4)(puVar4);
          puVar4[1] = uVar8;
        }
        pPVar9 = (PClass *)puVar4[1];
        bVar14 = pPVar9 != (PClass *)0x0;
        if (pPVar9 != pPVar6 && bVar14) {
          do {
            pPVar9 = pPVar9->ParentClass;
            bVar14 = pPVar9 != (PClass *)0x0;
            if (pPVar9 == pPVar6) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        if (!bVar14) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0052f68e;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      iVar12 = 0;
      if (3 < numparam) {
        VVar1 = param[3].field_0.field_3.Type;
        if (VVar1 == '\0') {
          iVar12 = param[3].field_0.i;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                        ,0x490,
                        "int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      iVar7 = 0;
      if (4 < numparam) {
        VVar1 = param[4].field_0.field_3.Type;
        if (VVar1 == '\0') {
          iVar7 = param[4].field_0.i;
        }
        else {
          iVar7 = 0;
          if (VVar1 != 0xff) {
            __assert_fail("param[paramnum].Type == REGT_INT",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                          ,0x491,
                          "int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)")
            ;
          }
        }
      }
      bVar14 = true;
      if (5 < numparam) {
        VVar1 = param[5].field_0.field_3.Type;
        if (VVar1 == '\0') {
          bVar14 = param[5].field_0.i != 0;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                        ,0x492,
                        "int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      lVar5 = puVar3[0x40];
      if (lVar5 == 0) {
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                        ,0x495,
                        "int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        iVar11 = 0;
      }
      else {
        iVar13 = (uint)(bVar14 ^ 1) * 3 + 0x7ffffffc;
        if (iVar12 != 0 || iVar7 != 0) {
          iVar13 = iVar7;
        }
        this = *(DPSprite **)(lVar5 + 0xe0);
        if ((this != (DPSprite *)0x0) && (((this->super_DObject).ObjectFlags & 0x20) != 0)) {
          *(undefined8 *)(lVar5 + 0xe0) = 0;
          this = (DPSprite *)0x0;
        }
        iVar11 = 0;
        if (this != (DPSprite *)0x0) {
          iVar11 = 0;
          do {
            iVar2 = this->ID;
            if ((iVar2 != 0) && (iVar12 <= iVar2 || iVar12 == 0 && iVar7 == 0)) {
              if (iVar13 < iVar2) break;
              if (bVar14 != false) {
                if (0x7ffffffc < iVar2) break;
                if (((iVar2 == -1) || (iVar2 == 1)) || (iVar2 == 1000)) goto LAB_0052f597;
              }
              DPSprite::SetState(this,(FState *)0x0,false);
              iVar11 = iVar11 + 1;
            }
LAB_0052f597:
            pDVar10 = (this->Next).field_0.p;
            if ((pDVar10 != (DPSprite *)0x0) && (((pDVar10->super_DObject).ObjectFlags & 0x20) != 0)
               ) {
              (this->Next).field_0.p = (DPSprite *)0x0;
              pDVar10 = (DPSprite *)0x0;
            }
            this = pDVar10;
          } while (pDVar10 != (DPSprite *)0x0);
        }
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                        ,0x4b5,
                        "int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      if (ret->RegType == '\0') {
        *(int *)ret->Location = iVar11;
        return 1;
      }
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/vm.h"
                    ,0x118,"void VMReturn::SetInt(int)");
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_0052f625:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0052f68e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x48f,"int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_ClearOverlays)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT_OPT(start) { start = 0; }
	PARAM_INT_OPT(stop) { stop = 0; }
	PARAM_BOOL_OPT(safety) { safety = true; }

	if (self->player == nullptr)
		ACTION_RETURN_INT(0);

	if (!start && !stop)
	{
		start = INT_MIN;
		stop = safety ? PSP_TARGETCENTER - 1 : INT_MAX;
	}

	unsigned int count = 0;
	int id;

	for (DPSprite *pspr = self->player->psprites; pspr != nullptr; pspr = pspr->GetNext())
	{
		id = pspr->GetID();

		if (id < start || id == 0)
			continue;
		else if (id > stop)
			break;

		if (safety)
		{
			if (id >= PSP_TARGETCENTER)
				break;
			else if (id == PSP_STRIFEHANDS || id == PSP_WEAPON || id == PSP_FLASH)
				continue;
		}

		pspr->SetState(nullptr);
		count++;
	}

	ACTION_RETURN_INT(count);
}